

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_format.h
# Opt level: O2

string * ST::format<unsigned_char>(string *__return_storage_ptr__,char *fmt_str,uchar *args)

{
  string_format_writer data;
  
  _ST_PRIVATE::string_format_writer::string_format_writer(&data,fmt_str);
  apply_format<unsigned_char>(&data.super_format_writer,args);
  string::from_utf8(__return_storage_ptr__,data.m_output.m_chars,data.m_output.m_size,check_validity
                   );
  _ST_PRIVATE::string_format_writer::~string_format_writer(&data);
  return __return_storage_ptr__;
}

Assistant:

ST_NODISCARD
    string format(const char *fmt_str, args_T &&...args)
    {
        _ST_PRIVATE::string_format_writer data(fmt_str);
        apply_format(data, std::forward<args_T>(args)...);
        return data.to_string(true, ST_DEFAULT_VALIDATION);
    }